

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passes.hpp
# Opt level: O2

TupleAccess * __thiscall
Pass1::create<TupleAccess,Expression_const*&,unsigned_long_const&,Type_const*&>
          (Pass1 *this,Expression **arguments,unsigned_long *arguments_1,Type **arguments_2)

{
  Expression *pEVar1;
  size_t sVar2;
  TupleAccess *expression;
  
  expression = (TupleAccess *)operator_new(0x30);
  pEVar1 = *arguments;
  sVar2 = *arguments_1;
  (expression->super_Expression).type = *arguments_2;
  (expression->super_Expression).next_expression = (Expression *)0x0;
  (expression->super_Expression)._vptr_Expression = (_func_int **)&PTR__Expression_00154078;
  expression->tuple = pEVar1;
  expression->index = sVar2;
  Block::add_expression(this->destination_block,(Expression *)expression);
  return expression;
}

Assistant:

T* create(A&&... arguments) {
		T* expression = new T(std::forward<A>(arguments)...);
		destination_block->add_expression(expression);
		return expression;
	}